

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void predict_inter_block(AV1_COMMON *cm,DecoderCodingBlock *dcb,BLOCK_SIZE bsize)

{
  MB_MODE_INFO *mbmi_00;
  int iVar1;
  scale_factors *psVar2;
  undefined1 in_DL;
  YV12_BUFFER_CONFIG *in_RSI;
  AV1_COMMON *in_RDI;
  AV1_COMMON *unaff_retaddr;
  scale_factors *ref_scale_factors;
  RefCntBuffer *ref_buf;
  MV_REFERENCE_FRAME frame;
  int ref;
  int mi_col;
  int mi_row;
  int num_planes;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  MV_REFERENCE_FRAME in_stack_ffffffffffffff9f;
  AV1_COMMON *in_stack_ffffffffffffffa0;
  int local_38;
  int in_stack_ffffffffffffffe8;
  undefined3 in_stack_ffffffffffffffec;
  int mi_row_00;
  YV12_BUFFER_CONFIG *src;
  
  mi_row_00 = CONCAT13(in_DL,in_stack_ffffffffffffffec);
  mbmi_00 = (MB_MODE_INFO *)**(undefined8 **)&in_RSI[0x25].monochrome;
  src = in_RSI;
  av1_num_planes(in_RDI);
  for (local_38 = 0; iVar1 = has_second_ref(mbmi_00), local_38 < iVar1 + 1; local_38 = local_38 + 1)
  {
    if ('\0' < mbmi_00->ref_frame[local_38]) {
      get_ref_frame_buf(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9f);
      psVar2 = get_ref_scale_factors_const(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9f);
      in_RSI[0x26].store_buf_adr[(long)local_38 + -4] = (uint8_t *)psVar2;
      av1_setup_pre_planes
                ((MACROBLOCKD *)unaff_retaddr,(int)((ulong)in_RDI >> 0x20),src,mi_row_00,
                 in_stack_ffffffffffffffe8,(scale_factors *)in_RSI,(int)ref_buf);
    }
  }
  dec_build_inter_predictor
            (unaff_retaddr,(DecoderCodingBlock *)in_RDI,(int)((ulong)src >> 0x20),(int)src,
             (BLOCK_SIZE)((uint)mi_row_00 >> 0x18));
  if (mbmi_00->motion_mode == '\x01') {
    dec_build_obmc_inter_predictors_sb((AV1_COMMON *)mbmi,_mi_row);
  }
  return;
}

Assistant:

static inline void predict_inter_block(AV1_COMMON *const cm,
                                       DecoderCodingBlock *dcb,
                                       BLOCK_SIZE bsize) {
  MACROBLOCKD *const xd = &dcb->xd;
  MB_MODE_INFO *mbmi = xd->mi[0];
  const int num_planes = av1_num_planes(cm);
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;
  for (int ref = 0; ref < 1 + has_second_ref(mbmi); ++ref) {
    const MV_REFERENCE_FRAME frame = mbmi->ref_frame[ref];
    if (frame < LAST_FRAME) {
      assert(is_intrabc_block(mbmi));
      assert(frame == INTRA_FRAME);
      assert(ref == 0);
    } else {
      const RefCntBuffer *ref_buf = get_ref_frame_buf(cm, frame);
      const struct scale_factors *ref_scale_factors =
          get_ref_scale_factors_const(cm, frame);

      xd->block_ref_scale_factors[ref] = ref_scale_factors;
      av1_setup_pre_planes(xd, ref, &ref_buf->buf, mi_row, mi_col,
                           ref_scale_factors, num_planes);
    }
  }

  dec_build_inter_predictor(cm, dcb, mi_row, mi_col, bsize);
  if (mbmi->motion_mode == OBMC_CAUSAL) {
    dec_build_obmc_inter_predictors_sb(cm, dcb);
  }
#if CONFIG_MISMATCH_DEBUG
  for (int plane = 0; plane < num_planes; ++plane) {
    const struct macroblockd_plane *pd = &xd->plane[plane];
    int pixel_c, pixel_r;
    mi_to_pixel_loc(&pixel_c, &pixel_r, mi_col, mi_row, 0, 0, pd->subsampling_x,
                    pd->subsampling_y);
    if (!is_chroma_reference(mi_row, mi_col, bsize, pd->subsampling_x,
                             pd->subsampling_y))
      continue;
    mismatch_check_block_pre(pd->dst.buf, pd->dst.stride,
                             cm->current_frame.order_hint, plane, pixel_c,
                             pixel_r, pd->width, pd->height,
                             xd->cur_buf->flags & YV12_FLAG_HIGHBITDEPTH);
  }
#endif
}